

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O2

void __thiscall libtorrent::aux::utp_socket_impl::send_reset(utp_socket_impl *this,uint16_t ack_nr)

{
  utp_socket_manager *this_00;
  long lVar1;
  utp_header h;
  __weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> local_70;
  error_code ec;
  endpoint local_4c;
  
  h.type_ver = '1';
  h.extension = '\0';
  big_endian_int<unsigned_short>::operator=(&h.connection_id,this->m_send_id);
  big_endian_int<unsigned_int>::operator=(&h.timestamp_difference_microseconds,this->m_reply_micro);
  big_endian_int<unsigned_int>::operator=(&h.wnd_size,0);
  lVar1 = random((aux *)0xffff);
  big_endian_int<unsigned_short>::operator=(&h.seq_nr,(unsigned_short)lVar1);
  big_endian_int<unsigned_short>::operator=(&h.ack_nr,ack_nr);
  lVar1 = ::std::chrono::_V2::system_clock::now();
  big_endian_int<unsigned_int>::operator=(&h.timestamp_microseconds,(uint)(lVar1 / 1000));
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this_00 = this->m_sm;
  ::std::__weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&local_70,
             (__weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2> *)this);
  boost::asio::ip::detail::endpoint::endpoint(&local_4c,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,(weak_ptr<libtorrent::aux::utp_socket_interface> *)&local_70,
             (endpoint *)&local_4c,(char *)&h,0x14,&ec,(udp_send_flags_t)0x0);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_70._M_refcount);
  return;
}

Assistant:

void utp_socket_impl::send_reset(std::uint16_t const ack_nr)
{
	INVARIANT_CHECK;

	utp_header h;
	h.type_ver = (ST_RESET << 4) | 1;
	h.extension = utp_no_extension;
	h.connection_id = m_send_id;
	h.timestamp_difference_microseconds = m_reply_micro;
	h.wnd_size = 0;
	h.seq_nr = std::uint16_t(random(0xffff));
	h.ack_nr = ack_nr;
	time_point const now = clock_type::now();
	h.timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

	UTP_LOGV("%8p: send_reset seq_nr:%d id:%d ack_nr:%d\n"
		, static_cast<void*>(this), int(h.seq_nr), int(m_send_id), int(ack_nr));

	// ignore errors here
	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(&h), sizeof(h), ec);
	if (ec)
	{
		UTP_LOGV("%8p: socket error: %s\n"
			, static_cast<void*>(this)
			, ec.message().c_str());
	}
}